

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_subdiv.c
# Opt level: O3

REF_STATUS ref_subdiv_to_hex(REF_GRID_conflict ref_grid)

{
  size_t sVar1;
  int iVar2;
  REF_NODE pRVar3;
  REF_GEOM pRVar4;
  REF_INT *pRVar5;
  REF_INT *pRVar6;
  REF_DBL *pRVar7;
  REF_EDGE pRVar8;
  void *pvVar9;
  undefined4 uVar10;
  uint uVar11;
  uint uVar12;
  REF_STATUS RVar13;
  uint uVar14;
  long lVar15;
  undefined8 uVar16;
  REF_FACE pRVar17;
  long lVar18;
  char *pcVar19;
  ulong uVar20;
  REF_CELL pRVar21;
  long lVar22;
  double dVar23;
  REF_INT node;
  REF_INT new_cell;
  REF_EDGE ref_edge;
  REF_FACE ref_face;
  REF_GLOB global;
  REF_CELL edg_cell;
  REF_INT quad [27];
  REF_INT nodes [27];
  REF_INT face_nodes [4];
  REF_INT bar [27];
  REF_INT local_23c;
  uint local_238;
  REF_INT local_234;
  REF_INT local_230;
  REF_INT local_22c;
  REF_EDGE local_228;
  REF_FACE local_220;
  void *local_218;
  void *local_210;
  REF_GLOB local_208;
  undefined4 local_1fc;
  undefined8 local_1f8;
  REF_CELL local_1f0;
  uint local_1e0;
  undefined4 local_1dc;
  uint local_1d8 [4];
  uint uStack_1c8;
  undefined4 uStack_1c4;
  REF_INT local_1c0;
  undefined4 local_1bc;
  uint local_168 [28];
  REF_INT local_f8 [6];
  REF_NODE local_e0;
  undefined8 local_d8;
  undefined8 uStack_d0;
  uint local_c8;
  uint uStack_c4;
  undefined8 uStack_c0;
  undefined1 local_b8 [16];
  uint local_a8 [4];
  uint local_98;
  uint local_94;
  
  pRVar3 = ref_grid->node;
  pRVar4 = ref_grid->geom;
  uVar11 = ref_edge_create(&local_228,ref_grid);
  if (uVar11 == 0) {
    uVar11 = ref_face_create(&local_220,ref_grid);
    pRVar8 = local_228;
    if (uVar11 == 0) {
      iVar2 = local_228->n;
      if ((long)iVar2 < 0) {
        pcVar19 = "malloc edge_node of REF_INT negative";
        uVar16 = 0x9f6;
LAB_001d0268:
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c",
               uVar16,"ref_subdiv_to_hex",pcVar19);
        return 1;
      }
      sVar1 = (long)iVar2 * 4;
      local_218 = malloc(sVar1);
      if (local_218 == (void *)0x0) {
        pcVar19 = "malloc edge_node of REF_INT NULL";
        uVar16 = 0x9f6;
      }
      else {
        local_e0 = pRVar3;
        if (iVar2 != 0) {
          memset(local_218,0xff,sVar1);
        }
        pRVar17 = local_220;
        iVar2 = local_220->n;
        if ((long)iVar2 < 0) {
          pcVar19 = "malloc face_node of REF_INT negative";
          uVar16 = 0x9f7;
          goto LAB_001d0268;
        }
        sVar1 = (long)iVar2 * 4;
        local_210 = malloc(sVar1);
        if (local_210 != (void *)0x0) {
          if (iVar2 != 0) {
            memset(local_210,0xff,sVar1);
          }
          pRVar3 = local_e0;
          local_23c = 0;
          if (0 < pRVar8->n) {
            do {
              uVar11 = ref_node_next_global(pRVar3,&local_208);
              if (uVar11 != 0) {
                uVar20 = (ulong)uVar11;
                pcVar19 = "next global";
                uVar16 = 0x9fa;
                goto LAB_001cfaca;
              }
              uVar11 = ref_node_add(pRVar3,local_208,&local_234);
              if (uVar11 != 0) {
                uVar20 = (ulong)uVar11;
                pcVar19 = "edge node";
                uVar16 = 0x9fb;
                goto LAB_001cfaca;
              }
              *(REF_INT *)((long)local_218 + (long)local_23c * 4) = local_234;
              uVar11 = ref_node_interpolate_edge
                                 (pRVar3,local_228->e2n[(long)local_23c * 2],
                                  local_228->e2n[local_23c * 2 + 1],0.5,local_234);
              if (uVar11 != 0) {
                uVar20 = (ulong)uVar11;
                pcVar19 = "new reals";
                uVar16 = 0x9ff;
                goto LAB_001cfaca;
              }
              if ((pRVar4->model != (void *)0x0) &&
                 (uVar11 = ref_geom_add_constrain_midnode
                                     (ref_grid,local_228->e2n[(long)local_23c * 2],
                                      local_228->e2n[local_23c * 2 + 1],0.5,local_234), uVar11 != 0)
                 ) {
                uVar20 = (ulong)uVar11;
                pcVar19 = "new geom";
                uVar16 = 0xa04;
                goto LAB_001cfaca;
              }
              local_23c = local_23c + 1;
              pRVar17 = local_220;
            } while (local_23c < local_228->n);
          }
          pRVar21 = ref_grid->cell[3];
          local_22c = 0;
          if (0 < pRVar17->n) {
            uVar11 = 0;
            do {
              uVar12 = ref_node_next_global(pRVar3,&local_208);
              if (uVar12 != 0) {
                pcVar19 = "next global";
                uVar16 = 0xa09;
LAB_001d072e:
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                       ,uVar16,"ref_subdiv_to_hex",(ulong)uVar12,pcVar19);
                return uVar12;
              }
              uVar12 = ref_node_add(pRVar3,local_208,&local_234);
              if (uVar12 != 0) {
                pcVar19 = "face node";
                uVar16 = 0xa0a;
                goto LAB_001d072e;
              }
              *(REF_INT *)((long)local_210 + (long)local_22c * 4) = local_234;
              pRVar5 = local_220->f2n;
              lVar15 = 0;
              do {
                local_168[lVar15] = pRVar5[(long)local_22c * 4 + lVar15];
                lVar15 = lVar15 + 1;
              } while (lVar15 != 3);
              local_168[3] = 0xffffffff;
              uVar12 = ref_cell_with(pRVar21,(REF_INT *)local_168,(REF_INT *)&local_238);
              if ((uVar12 != 0) && (uVar12 != 5)) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                       ,0xa11,"ref_subdiv_to_hex",(ulong)uVar12);
                uVar11 = uVar12;
              }
              if ((uVar12 != 5) && (uVar12 != 0)) {
                return uVar11;
              }
              if ((long)(int)local_238 != -1) {
                local_168[3] = pRVar21->c2n[(long)pRVar21->size_per * (long)(int)local_238 + 3];
              }
              uVar12 = ref_node_interpolate_face
                                 (pRVar3,local_168[0],local_168[1],local_168[2],local_234);
              if (uVar12 != 0) {
                pcVar19 = "interp new face node";
                uVar16 = 0xa15;
                goto LAB_001d072e;
              }
              if (((pRVar4->model != (void *)0x0) && (local_168[3] != 0xffffffff)) &&
                 (uVar12 = ref_geom_add_constrain_inside_midnode
                                     (ref_grid,(REF_INT *)local_168,local_234), uVar12 != 0)) {
                pcVar19 = "geom constrain new face node";
                uVar16 = 0xa18;
                goto LAB_001d072e;
              }
              local_22c = local_22c + 1;
            } while (local_22c < local_220->n);
          }
          pRVar21 = ref_grid->cell[8];
          local_238 = 0;
          if (0 < pRVar21->max) {
            do {
              RVar13 = ref_cell_nodes(pRVar21,local_238,(REF_INT *)local_168);
              if (RVar13 == 0) {
                if (0 < pRVar21->face_per) {
                  lVar22 = 0;
                  lVar15 = 0;
                  do {
                    pRVar5 = pRVar21->c2n;
                    pRVar6 = pRVar21->f2n;
                    lVar18 = 0;
                    do {
                      local_f8[lVar18] =
                           pRVar5[(long)pRVar21->size_per * (long)(int)local_238 +
                                  (long)*(int *)((long)pRVar6 + lVar18 * 4 + lVar22)];
                      lVar18 = lVar18 + 1;
                    } while (lVar18 != 4);
                    uVar11 = ref_face_with(local_220,local_f8,&local_22c);
                    if (uVar11 != 0) {
                      uVar16 = 0xa29;
                      goto LAB_001d06a5;
                    }
                    if ((long)local_22c == -1) {
                      pcVar19 = "tet face not found";
                      uVar16 = 0xa2a;
                      goto LAB_001d0268;
                    }
                    *(undefined4 *)((long)&local_1f8 + lVar15 * 4) =
                         *(undefined4 *)((long)local_210 + (long)local_22c * 4);
                    lVar15 = lVar15 + 1;
                    lVar22 = lVar22 + 0x10;
                  } while (lVar15 < pRVar21->face_per);
                }
                pvVar9 = local_218;
                if (0 < pRVar21->edge_per) {
                  lVar15 = 0;
                  do {
                    lVar22 = (long)(int)local_238 * (long)pRVar21->size_per;
                    uVar11 = ref_edge_with(local_228,pRVar21->c2n[pRVar21->e2n[lVar15 * 2] + lVar22]
                                           ,pRVar21->c2n
                                            [(long)(int)lVar22 + (long)pRVar21->e2n[lVar15 * 2 + 1]]
                                           ,&local_23c);
                    if (uVar11 != 0) {
                      uVar20 = (ulong)uVar11;
                      pcVar19 = "find edge";
                      uVar16 = 0xa31;
                      goto LAB_001cfaca;
                    }
                    if ((long)local_23c == -1) {
                      pcVar19 = "tet edge not found";
                      uVar16 = 0xa32;
                      goto LAB_001d0268;
                    }
                    local_a8[lVar15] = *(uint *)((long)pvVar9 + (long)local_23c * 4);
                    lVar15 = lVar15 + 1;
                  } while (lVar15 < pRVar21->edge_per);
                }
                uVar11 = ref_node_next_global(pRVar3,&local_208);
                if (uVar11 != 0) {
                  uVar20 = (ulong)uVar11;
                  pcVar19 = "next global";
                  uVar16 = 0xa36;
                  goto LAB_001cfaca;
                }
                uVar12 = ref_node_add(pRVar3,local_208,&local_234);
                uVar11 = local_a8[0];
                if (uVar12 != 0) {
                  uVar20 = (ulong)uVar12;
                  pcVar19 = "edge node";
                  uVar16 = 0xa37;
                  goto LAB_001cfaca;
                }
                pRVar7 = pRVar3->real;
                uVar12 = pRVar21->node_per;
                lVar15 = 0;
                do {
                  pRVar7[(long)local_234 * 0xf + lVar15] = 0.0;
                  if (0 < (int)uVar12) {
                    dVar23 = 0.0;
                    uVar20 = 0;
                    do {
                      dVar23 = dVar23 + pRVar7[lVar15 + (long)(int)local_168[uVar20] * 0xf] * 0.25;
                      pRVar7[(long)local_234 * 0xf + lVar15] = dVar23;
                      uVar20 = uVar20 + 1;
                    } while (uVar12 != uVar20);
                  }
                  lVar15 = lVar15 + 1;
                } while (lVar15 != 3);
                local_1d8[0] = local_168[0];
                local_1d8[1] = local_a8[0];
                local_c8 = local_a8[1];
                uStack_c4 = local_a8[2];
                local_d8 = local_1f0;
                uStack_d0 = 0;
                uStack_c0 = 0;
                local_1d8[2] = (uint)((ulong)local_1f0 >> 0x20);
                uStack_1c4 = SUB84(local_1f0,0);
                local_1d8[3] = local_a8[1];
                uStack_1c8 = local_a8[2];
                local_1c0 = local_234;
                local_1dc = local_1f8._4_4_;
                local_1bc = local_1f8._4_4_;
                uVar14 = ref_cell_add(ref_grid->cell[0xb],(REF_INT *)local_1d8,&local_230);
                uVar12 = local_a8[3];
                if (uVar14 != 0) {
                  uVar20 = (ulong)uVar14;
                  pcVar19 = "add";
                  uVar16 = 0xa48;
                  goto LAB_001cfaca;
                }
                local_1d8[0] = local_168[1];
                local_1d8[1] = local_a8[3];
                local_b8._4_4_ = local_d8._4_4_;
                local_b8._0_4_ = local_d8._4_4_;
                local_b8._8_4_ = local_d8._4_4_;
                local_b8._12_4_ = local_d8._4_4_;
                local_1d8[2] = local_d8._4_4_;
                local_1d8[3] = uVar11;
                local_1e0 = local_98;
                uStack_1c8 = local_98;
                local_1fc = (undefined4)local_1f8;
                uStack_1c4 = (undefined4)local_1f8;
                local_1c0 = local_234;
                local_1bc = (REF_INT)local_d8;
                uVar14 = ref_cell_add(ref_grid->cell[0xb],(REF_INT *)local_1d8,&local_230);
                uVar11 = local_94;
                uVar10 = local_1dc;
                if (uVar14 != 0) {
                  uVar20 = (ulong)uVar14;
                  pcVar19 = "add";
                  uVar16 = 0xa52;
                  goto LAB_001cfaca;
                }
                local_1d8[0] = local_168[2];
                local_1d8[1] = local_c8;
                local_1d8[2] = local_b8._0_4_;
                local_1d8[3] = uVar12;
                uStack_1c8 = local_94;
                uStack_1c4 = local_1dc;
                local_1c0 = local_234;
                local_1bc = local_1fc;
                uVar12 = ref_cell_add(ref_grid->cell[0xb],(REF_INT *)local_1d8,&local_230);
                if (uVar12 != 0) {
                  uVar20 = (ulong)uVar12;
                  pcVar19 = "add";
                  uVar16 = 0xa5c;
                  goto LAB_001cfaca;
                }
                local_1d8[0] = local_168[3];
                local_1d8[1] = local_1e0;
                local_1d8[2] = (REF_INT)local_d8;
                local_1d8[3] = uStack_c4;
                uStack_1c8 = uVar11;
                uStack_1c4 = local_1fc;
                local_1c0 = local_234;
                local_1bc = uVar10;
                uVar11 = ref_cell_add(ref_grid->cell[0xb],(REF_INT *)local_1d8,&local_230);
                if (uVar11 != 0) {
                  uVar20 = (ulong)uVar11;
                  pcVar19 = "add";
                  uVar16 = 0xa66;
                  goto LAB_001cfaca;
                }
                uVar11 = ref_cell_remove(pRVar21,local_238);
                if (uVar11 != 0) {
                  uVar20 = (ulong)uVar11;
                  pcVar19 = "remove tet";
                  uVar16 = 0xa68;
                  goto LAB_001cfaca;
                }
              }
              local_238 = local_238 + 1;
            } while ((int)local_238 < pRVar21->max);
          }
          pvVar9 = local_218;
          pRVar21 = ref_grid->cell[3];
          local_238 = 0;
          if (0 < pRVar21->max) {
            do {
              RVar13 = ref_cell_nodes(pRVar21,local_238,(REF_INT *)local_168);
              if (RVar13 == 0) {
                local_f8[2] = local_168[2];
                uVar11 = ref_face_with(local_220,local_f8,&local_22c);
                if (uVar11 != 0) {
                  uVar16 = 0xa72;
LAB_001d06a5:
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                         ,uVar16,"ref_subdiv_to_hex",(ulong)uVar11,"find face");
                  printf("%d tri %d %d %d  %d\n",(ulong)local_238,(ulong)local_168[0],
                         (ulong)local_168[1],(ulong)local_168[2],(ulong)local_168[3]);
                  return uVar11;
                }
                if ((long)local_22c == -1) {
                  pcVar19 = "tri face not found";
                  uVar16 = 0xa73;
                  goto LAB_001d0268;
                }
                local_234 = *(REF_INT *)((long)local_210 + (long)local_22c * 4);
                local_1d8[ref_grid->cell[6]->node_per] = local_168[ref_grid->cell[3]->node_per];
                local_1d8[0] = local_168[0];
                uVar11 = ref_edge_with(local_228,local_168[0],local_168[1],&local_23c);
                if (uVar11 != 0) {
                  uVar20 = (ulong)uVar11;
                  pcVar19 = "find edge after";
                  uVar16 = 0xa78;
                  goto LAB_001cfaca;
                }
                local_1d8[1] = *(uint *)((long)pvVar9 + (long)local_23c * 4);
                local_1d8[2] = local_234;
                uVar11 = ref_edge_with(local_228,local_168[2],local_168[0],&local_23c);
                if (uVar11 != 0) {
                  uVar20 = (ulong)uVar11;
                  pcVar19 = "find edge before";
                  uVar16 = 0xa7b;
                  goto LAB_001cfaca;
                }
                local_1d8[3] = *(uint *)((long)pvVar9 + (long)local_23c * 4);
                uVar11 = ref_cell_add(ref_grid->cell[6],(REF_INT *)local_1d8,&local_230);
                if (uVar11 != 0) {
                  uVar20 = (ulong)uVar11;
                  pcVar19 = "add";
                  uVar16 = 0xa7d;
                  goto LAB_001cfaca;
                }
                local_1d8[0] = local_168[1];
                uVar11 = ref_edge_with(local_228,local_168[1],local_168[2],&local_23c);
                if (uVar11 != 0) {
                  uVar20 = (ulong)uVar11;
                  pcVar19 = "find edge after";
                  uVar16 = 0xa7f;
                  goto LAB_001cfaca;
                }
                local_1d8[1] = *(uint *)((long)pvVar9 + (long)local_23c * 4);
                local_1d8[2] = local_234;
                uVar11 = ref_edge_with(local_228,local_168[0],local_168[1],&local_23c);
                if (uVar11 != 0) {
                  uVar20 = (ulong)uVar11;
                  pcVar19 = "find edge before";
                  uVar16 = 0xa82;
                  goto LAB_001cfaca;
                }
                local_1d8[3] = *(uint *)((long)pvVar9 + (long)local_23c * 4);
                uVar11 = ref_cell_add(ref_grid->cell[6],(REF_INT *)local_1d8,&local_230);
                if (uVar11 != 0) {
                  uVar20 = (ulong)uVar11;
                  pcVar19 = "add";
                  uVar16 = 0xa84;
                  goto LAB_001cfaca;
                }
                local_1d8[0] = local_168[2];
                uVar11 = ref_edge_with(local_228,local_168[2],local_168[0],&local_23c);
                if (uVar11 != 0) {
                  uVar20 = (ulong)uVar11;
                  pcVar19 = "find edge after";
                  uVar16 = 0xa86;
                  goto LAB_001cfaca;
                }
                local_1d8[1] = *(uint *)((long)pvVar9 + (long)local_23c * 4);
                local_1d8[2] = local_234;
                uVar11 = ref_edge_with(local_228,local_168[1],local_168[2],&local_23c);
                if (uVar11 != 0) {
                  uVar20 = (ulong)uVar11;
                  pcVar19 = "find edge before";
                  uVar16 = 0xa89;
                  goto LAB_001cfaca;
                }
                local_1d8[3] = *(uint *)((long)pvVar9 + (long)local_23c * 4);
                uVar11 = ref_cell_add(ref_grid->cell[6],(REF_INT *)local_1d8,&local_230);
                if (uVar11 != 0) {
                  uVar20 = (ulong)uVar11;
                  pcVar19 = "add";
                  uVar16 = 0xa8b;
                  goto LAB_001cfaca;
                }
                uVar11 = ref_cell_remove(pRVar21,local_238);
                if (uVar11 != 0) {
                  uVar20 = (ulong)uVar11;
                  pcVar19 = "remove tri";
                  uVar16 = 0xa8c;
                  goto LAB_001cfaca;
                }
              }
              local_238 = local_238 + 1;
            } while ((int)local_238 < pRVar21->max);
          }
          pRVar21 = ref_grid->cell[0];
          uVar11 = ref_cell_create((REF_CELL *)&local_1f8,REF_CELL_EDG);
          if (uVar11 == 0) {
            local_238 = 0;
            if (0 < pRVar21->max) {
              local_d8 = pRVar21;
              do {
                RVar13 = ref_cell_nodes(pRVar21,local_238,(REF_INT *)local_168);
                if (RVar13 == 0) {
                  iVar2 = ref_grid->cell[0]->node_per;
                  local_a8[iVar2] = local_168[iVar2];
                  local_a8[0] = local_168[0];
                  uVar11 = ref_edge_with(local_228,local_168[0],local_168[1],&local_23c);
                  pvVar9 = local_218;
                  if (uVar11 != 0) {
                    uVar20 = (ulong)uVar11;
                    pcVar19 = "find edge";
                    uVar16 = 0xa95;
                    goto LAB_001cfaca;
                  }
                  local_a8[1] = *(uint *)((long)local_218 + (long)local_23c * 4);
                  uVar11 = ref_cell_add((REF_CELL)CONCAT44(local_1f8._4_4_,(undefined4)local_1f8),
                                        (REF_INT *)local_a8,&local_230);
                  if (uVar11 != 0) {
                    uVar20 = (ulong)uVar11;
                    pcVar19 = "add";
                    uVar16 = 0xa97;
                    goto LAB_001cfaca;
                  }
                  local_a8[0] = *(uint *)((long)pvVar9 + (long)local_23c * 4);
                  local_a8[1] = local_168[1];
                  uVar11 = ref_cell_add((REF_CELL)CONCAT44(local_1f8._4_4_,(undefined4)local_1f8),
                                        (REF_INT *)local_a8,&local_230);
                  pRVar21 = local_d8;
                  if (uVar11 != 0) {
                    uVar20 = (ulong)uVar11;
                    pcVar19 = "add";
                    uVar16 = 0xa9a;
                    goto LAB_001cfaca;
                  }
                }
                local_238 = local_238 + 1;
              } while ((int)local_238 < pRVar21->max);
            }
            uVar11 = ref_cell_free(ref_grid->cell[0]);
            if (uVar11 == 0) {
              ref_grid->cell[0] = (REF_CELL)CONCAT44(local_1f8._4_4_,(undefined4)local_1f8);
              free(local_210);
              free(local_218);
              uVar11 = ref_face_free(local_220);
              if (uVar11 == 0) {
                uVar11 = ref_edge_free(local_228);
                if (uVar11 == 0) {
                  uVar11 = ref_node_synchronize_globals(local_e0);
                  if (uVar11 == 0) {
                    return 0;
                  }
                  uVar20 = (ulong)uVar11;
                  pcVar19 = "sync globals";
                  uVar16 = 0xaa4;
                }
                else {
                  uVar20 = (ulong)uVar11;
                  pcVar19 = "free edge";
                  uVar16 = 0xaa2;
                }
              }
              else {
                uVar20 = (ulong)uVar11;
                pcVar19 = "free face";
                uVar16 = 0xaa1;
              }
            }
            else {
              uVar20 = (ulong)uVar11;
              pcVar19 = "free old edge";
              uVar16 = 0xa9c;
            }
          }
          else {
            uVar20 = (ulong)uVar11;
            pcVar19 = "new edges";
            uVar16 = 0xa90;
          }
          goto LAB_001cfaca;
        }
        pcVar19 = "malloc face_node of REF_INT NULL";
        uVar16 = 0x9f7;
        local_210 = (void *)0x0;
      }
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c",
             uVar16,"ref_subdiv_to_hex",pcVar19);
      return 2;
    }
    uVar20 = (ulong)uVar11;
    pcVar19 = "create face";
    uVar16 = 0x9f5;
  }
  else {
    uVar20 = (ulong)uVar11;
    pcVar19 = "create edge";
    uVar16 = 0x9f4;
  }
LAB_001cfaca:
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c",uVar16,
         "ref_subdiv_to_hex",uVar20,pcVar19);
  return (REF_STATUS)uVar20;
}

Assistant:

REF_FCN REF_STATUS ref_subdiv_to_hex(REF_GRID ref_grid) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_GEOM ref_geom = ref_grid_geom(ref_grid);
  REF_CELL ref_cell;
  REF_EDGE ref_edge;
  REF_FACE ref_face;
  REF_INT *edge_node, *face_node, face, edge, node, new_cell, i;
  REF_INT cell, nodes[REF_CELL_MAX_SIZE_PER], face_nodes[4];
  REF_INT quad[REF_CELL_MAX_SIZE_PER], bar[REF_CELL_MAX_SIZE_PER];
  REF_GLOB global;
  REF_CELL edg_cell;

  RSS(ref_edge_create(&ref_edge, ref_grid), "create edge");
  RSS(ref_face_create(&ref_face, ref_grid), "create face");
  ref_malloc_init(edge_node, ref_edge_n(ref_edge), REF_INT, REF_EMPTY);
  ref_malloc_init(face_node, ref_face_n(ref_face), REF_INT, REF_EMPTY);

  each_ref_edge(ref_edge, edge) {
    RSS(ref_node_next_global(ref_node, &global), "next global");
    RSS(ref_node_add(ref_node, global, &node), "edge node");
    edge_node[edge] = node;
    RSS(ref_node_interpolate_edge(ref_node, ref_edge_e2n(ref_edge, 0, edge),
                                  ref_edge_e2n(ref_edge, 1, edge), 0.5, node),
        "new reals");
    if (ref_geom_model_loaded(ref_geom))
      RSS(ref_geom_add_constrain_midnode(
              ref_grid, ref_edge_e2n(ref_edge, 0, edge),
              ref_edge_e2n(ref_edge, 1, edge), 0.5, node),
          "new geom");
  }

  ref_cell = ref_grid_tri(ref_grid);
  each_ref_face(ref_face, face) {
    RSS(ref_node_next_global(ref_node, &global), "next global");
    RSS(ref_node_add(ref_node, global, &node), "face node");
    face_node[face] = node;

    for (i = 0; i < 3; i++) {
      nodes[i] = ref_face_f2n(ref_face, i, face);
    }
    nodes[3] = REF_EMPTY;
    RXS(ref_cell_with(ref_cell, nodes, &cell), REF_NOT_FOUND, "find tri");
    if (REF_EMPTY != cell) nodes[3] = ref_cell_c2n(ref_cell, 3, cell);

    RSS(ref_node_interpolate_face(ref_node, nodes[0], nodes[1], nodes[2], node),
        "interp new face node");
    if (ref_geom_model_loaded(ref_geom) && REF_EMPTY != nodes[3]) {
      RSS(ref_geom_add_constrain_inside_midnode(ref_grid, nodes, node),
          "geom constrain new face node");
    }
  }

  ref_cell = ref_grid_tet(ref_grid);
  each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
    REF_INT tet_face_nodes[4], tet_edge_nodes[6];
    REF_INT cell_face, cell_edge, cell_node;
    REF_INT hex[REF_CELL_MAX_SIZE_PER];

    each_ref_cell_cell_face(ref_cell, cell_face) {
      /* repeat first node to mark tri */
      for (i = 0; i < 4; i++)
        face_nodes[i] = ref_cell_f2n(ref_cell, i, cell_face, cell);
      RSB(ref_face_with(ref_face, face_nodes, &face), "find face", {
        printf("%d tri %d %d %d  %d\n", cell, nodes[0], nodes[1], nodes[2],
               nodes[3]);
      });
      RUS(REF_EMPTY, face, "tet face not found");
      tet_face_nodes[cell_face] = face_node[face];
    }

    each_ref_cell_cell_edge(ref_cell, cell_edge) {
      RSS(ref_edge_with(ref_edge, ref_cell_e2n(ref_cell, 0, cell_edge, cell),
                        ref_cell_e2n(ref_cell, 1, cell_edge, cell), &edge),
          "find edge");
      RUS(REF_EMPTY, edge, "tet edge not found");
      tet_edge_nodes[cell_edge] = edge_node[edge];
    }

    RSS(ref_node_next_global(ref_node, &global), "next global");
    RSS(ref_node_add(ref_node, global, &node), "edge node");
    for (i = 0; i < 3; i++) {
      ref_node_xyz(ref_node, i, node) = 0.0;
      each_ref_cell_cell_node(ref_cell, cell_node) {
        ref_node_xyz(ref_node, i, node) +=
            0.25 * ref_node_xyz(ref_node, i, nodes[cell_node]);
      }
    }

    hex[0] = nodes[0];
    hex[1] = tet_edge_nodes[0];
    hex[2] = tet_face_nodes[3];
    hex[3] = tet_edge_nodes[1];
    hex[4] = tet_edge_nodes[2];
    hex[5] = tet_face_nodes[2];
    hex[6] = node;
    hex[7] = tet_face_nodes[1];
    RSS(ref_cell_add(ref_grid_hex(ref_grid), hex, &new_cell), "add");

    hex[0] = nodes[1];
    hex[1] = tet_edge_nodes[3];
    hex[2] = tet_face_nodes[3];
    hex[3] = tet_edge_nodes[0];
    hex[4] = tet_edge_nodes[4];
    hex[5] = tet_face_nodes[0];
    hex[6] = node;
    hex[7] = tet_face_nodes[2];
    RSS(ref_cell_add(ref_grid_hex(ref_grid), hex, &new_cell), "add");

    hex[0] = nodes[2];
    hex[1] = tet_edge_nodes[1];
    hex[2] = tet_face_nodes[3];
    hex[3] = tet_edge_nodes[3];
    hex[4] = tet_edge_nodes[5];
    hex[5] = tet_face_nodes[1];
    hex[6] = node;
    hex[7] = tet_face_nodes[0];
    RSS(ref_cell_add(ref_grid_hex(ref_grid), hex, &new_cell), "add");

    hex[0] = nodes[3];
    hex[1] = tet_edge_nodes[4];
    hex[2] = tet_face_nodes[2];
    hex[3] = tet_edge_nodes[2];
    hex[4] = tet_edge_nodes[5];
    hex[5] = tet_face_nodes[0];
    hex[6] = node;
    hex[7] = tet_face_nodes[1];
    RSS(ref_cell_add(ref_grid_hex(ref_grid), hex, &new_cell), "add");

    RSS(ref_cell_remove(ref_cell, cell), "remove tet");
  }

  ref_cell = ref_grid_tri(ref_grid);
  each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
    for (i = 0; i < 3; i++) face_nodes[i] = nodes[i];
    face_nodes[3] = face_nodes[0]; /* repeat first node to mark tri */
    RSB(ref_face_with(ref_face, face_nodes, &face), "find face", {
      printf("%d tri %d %d %d  %d\n", cell, nodes[0], nodes[1], nodes[2],
             nodes[3]);
    });
    RUS(REF_EMPTY, face, "tri face not found");
    node = face_node[face];
    quad[ref_cell_id_index(ref_grid_qua(ref_grid))] =
        nodes[ref_cell_id_index(ref_grid_tri(ref_grid))];
    quad[0] = nodes[0];
    RSS(ref_edge_with(ref_edge, nodes[0], nodes[1], &edge), "find edge after");
    quad[1] = edge_node[edge];
    quad[2] = node;
    RSS(ref_edge_with(ref_edge, nodes[2], nodes[0], &edge), "find edge before");
    quad[3] = edge_node[edge];
    RSS(ref_cell_add(ref_grid_qua(ref_grid), quad, &new_cell), "add");
    quad[0] = nodes[1];
    RSS(ref_edge_with(ref_edge, nodes[1], nodes[2], &edge), "find edge after");
    quad[1] = edge_node[edge];
    quad[2] = node;
    RSS(ref_edge_with(ref_edge, nodes[0], nodes[1], &edge), "find edge before");
    quad[3] = edge_node[edge];
    RSS(ref_cell_add(ref_grid_qua(ref_grid), quad, &new_cell), "add");
    quad[0] = nodes[2];
    RSS(ref_edge_with(ref_edge, nodes[2], nodes[0], &edge), "find edge after");
    quad[1] = edge_node[edge];
    quad[2] = node;
    RSS(ref_edge_with(ref_edge, nodes[1], nodes[2], &edge), "find edge before");
    quad[3] = edge_node[edge];
    RSS(ref_cell_add(ref_grid_qua(ref_grid), quad, &new_cell), "add");
    RSS(ref_cell_remove(ref_cell, cell), "remove tri");
  }

  ref_cell = ref_grid_edg(ref_grid);
  RSS(ref_cell_create(&edg_cell, REF_CELL_EDG), "new edges");
  each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
    bar[ref_cell_id_index(ref_grid_edg(ref_grid))] =
        nodes[ref_cell_id_index(ref_grid_edg(ref_grid))];
    bar[0] = nodes[0];
    RSS(ref_edge_with(ref_edge, nodes[0], nodes[1], &edge), "find edge");
    bar[1] = edge_node[edge];
    RSS(ref_cell_add(edg_cell, bar, &new_cell), "add");
    bar[0] = edge_node[edge];
    bar[1] = nodes[1];
    RSS(ref_cell_add(edg_cell, bar, &new_cell), "add");
  }
  RSS(ref_cell_free(ref_grid_edg(ref_grid)), "free old edge");
  ref_grid_edg(ref_grid) = edg_cell;

  ref_free(face_node);
  ref_free(edge_node);
  RSS(ref_face_free(ref_face), "free face");
  RSS(ref_edge_free(ref_edge), "free edge");

  RSS(ref_node_synchronize_globals(ref_node), "sync globals");

  return REF_SUCCESS;
}